

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adynarray.c
# Opt level: O0

void * private_ACUtils_ADynArray_constructWithAllocator
                 (size_t typeSize,ACUtilsReallocator reallocator,ACUtilsDeallocator deallocator)

{
  undefined8 uVar1;
  ACUtilsReallocator local_60;
  private_ACUtils_DynArray_Prototype tmpPrototype;
  private_ACUtils_DynArray_Prototype *prototype;
  ACUtilsDeallocator deallocator_local;
  ACUtilsReallocator reallocator_local;
  size_t typeSize_local;
  
  if ((reallocator == (ACUtilsReallocator)0x0) || (deallocator == (ACUtilsDeallocator)0x0)) {
    typeSize_local = 0;
  }
  else {
    tmpPrototype.buffer = (char *)(*reallocator)((void *)0x0,0x30);
    if (tmpPrototype.buffer != (char *)0x0) {
      tmpPrototype.deallocator = (ACUtilsDeallocator)0x0;
      tmpPrototype.growStrategy = (ACUtilsGrowStrategy)0x0;
      tmpPrototype.size = 0;
      tmpPrototype.capacity = 0;
      local_60 = reallocator;
      tmpPrototype.reallocator = (ACUtilsReallocator)deallocator;
      memcpy(tmpPrototype.buffer,&local_60,0x30);
      *(code **)(tmpPrototype.buffer + 0x10) = private_ACUtils_ADynArray_growStrategyDefault;
      tmpPrototype.buffer[0x18] = '\0';
      tmpPrototype.buffer[0x19] = '\0';
      tmpPrototype.buffer[0x1a] = '\0';
      tmpPrototype.buffer[0x1b] = '\0';
      tmpPrototype.buffer[0x1c] = '\0';
      tmpPrototype.buffer[0x1d] = '\0';
      tmpPrototype.buffer[0x1e] = '\0';
      tmpPrototype.buffer[0x1f] = '\0';
      uVar1 = (**(code **)(tmpPrototype.buffer + 0x10))
                        (*(undefined8 *)(tmpPrototype.buffer + 0x18),typeSize);
      *(undefined8 *)(tmpPrototype.buffer + 0x20) = uVar1;
      uVar1 = (**(code **)tmpPrototype.buffer)(0,*(long *)(tmpPrototype.buffer + 0x20) * typeSize);
      *(undefined8 *)(tmpPrototype.buffer + 0x28) = uVar1;
      if (*(long *)(tmpPrototype.buffer + 0x28) == 0) {
        private_ACUtils_ADynArray_destruct(tmpPrototype.buffer);
        return (void *)0x0;
      }
    }
    typeSize_local = (size_t)tmpPrototype.buffer;
  }
  return (void *)typeSize_local;
}

Assistant:

ACUTILS_HD_FUNC void* private_ACUtils_ADynArray_constructWithAllocator(size_t typeSize, ACUtilsReallocator reallocator,
                                                                       ACUtilsDeallocator deallocator)
{
    struct private_ACUtils_DynArray_Prototype* prototype;
    if(reallocator == NULL || deallocator == NULL)
        return NULL;
    prototype = (struct private_ACUtils_DynArray_Prototype*) reallocator(NULL, sizeof(struct private_ACUtils_DynArray_Prototype));
    if(prototype != NULL) {
        struct private_ACUtils_DynArray_Prototype tmpPrototype = {reallocator, deallocator};
        memcpy(prototype, &tmpPrototype, sizeof(struct private_ACUtils_DynArray_Prototype));
        prototype->growStrategy = private_ACUtils_ADynArray_growStrategyDefault;
        prototype->size = 0;
        prototype->capacity = prototype->growStrategy(prototype->size, typeSize);
        prototype->buffer = (char*) prototype->reallocator(NULL, prototype->capacity * typeSize);
        if(prototype->buffer == NULL) {
            private_ACUtils_ADynArray_destruct(prototype);
            return NULL;
        }
    }
    return prototype;
}